

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHeat2D_kry.c
# Opt level: O2

int PsetupHeat(sunrealtype tt,N_Vector uu,N_Vector up,N_Vector rr,sunrealtype c_j,void *prec_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = N_VGetArrayPointer(*(undefined8 *)((long)prec_data + 0x18));
  lVar2 = *prec_data;
  N_VConst(0x3ff0000000000000);
  dVar1 = *(double *)((long)prec_data + 0x10);
  lVar4 = lVar3 + lVar2 * 8 + 8;
  for (lVar3 = 1; lVar3 < lVar2 + -1; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar2 + -2 != lVar5; lVar5 = lVar5 + 1) {
      *(double *)(lVar4 + lVar5 * 8) = 1.0 / (dVar1 * 4.0 + c_j);
    }
    lVar4 = lVar4 + lVar2 * 8;
  }
  return 0;
}

Assistant:

int PsetupHeat(sunrealtype tt, N_Vector uu, N_Vector up, N_Vector rr,
               sunrealtype c_j, void* prec_data)
{
  sunindextype i, j, offset, loc, mm;
  sunrealtype *ppv, pelinv;
  UserData data;

  data = (UserData)prec_data;
  ppv  = N_VGetArrayPointer(data->pp);
  mm   = data->mm;

  /* Initialize the entire vector to 1., then set the interior points to the
     correct value for preconditioning. */
  N_VConst(ONE, data->pp);

  /* Compute the inverse of the preconditioner diagonal elements. */
  pelinv = ONE / (c_j + FOUR * data->coeff);

  for (j = 1; j < mm - 1; j++)
  {
    offset = mm * j;
    for (i = 1; i < mm - 1; i++)
    {
      loc      = offset + i;
      ppv[loc] = pelinv;
    }
  }

  return (0);
}